

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

RPCHelpMan * wallet::importprivkey(void)

{
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  string description_02;
  string description_03;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff4b8;
  undefined8 in_stack_fffffffffffff4c0;
  undefined8 in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4d0;
  _Manager_type in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4e8;
  pointer in_stack_fffffffffffff4f8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff500;
  pointer pRVar3;
  pointer in_stack_fffffffffffff508;
  pointer pRVar4;
  _Vector_impl_data in_stack_fffffffffffff510;
  undefined1 in_stack_fffffffffffff528 [16];
  allocator<char> in_stack_fffffffffffff538;
  bool in_stack_fffffffffffff539;
  bool bVar5;
  undefined6 in_stack_fffffffffffff53a;
  pointer in_stack_fffffffffffff540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff558 [16];
  undefined1 in_stack_fffffffffffff568 [56];
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  char *local_7a0;
  size_type local_798;
  char local_790 [8];
  undefined8 uStack_788;
  string local_780 [32];
  string local_760 [32];
  RPCResult local_740;
  RPCArgOptions local_6b8;
  string local_670 [32];
  UniValue local_650;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5f8;
  string local_598 [32];
  RPCArgOptions local_578;
  string local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f0;
  string local_490 [32];
  RPCArgOptions local_470;
  string local_428 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_408;
  undefined1 local_3b0;
  string local_3a8 [32];
  RPCArg local_388 [3];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"importprivkey",(allocator<char> *)&stack0xfffffffffffff55f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nAdds a private key (as returned by dumpprivkey) to your wallet. Requires a new wallet backup.\nHint: use importmulti to import more than one private key.\n\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\nmay report that the imported key exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\nThe rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\nbut the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\nNote: Use \"getwalletinfo\" to query the scanning progress.\nNote: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n"
             ,(allocator<char> *)&stack0xfffffffffffff55e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"privkey",(allocator<char> *)&stack0xfffffffffffff53f);
  local_408._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"The private key (see dumpprivkey)",
             (allocator<char> *)&stack0xfffffffffffff53e);
  local_470.oneline_description._M_dataplus._M_p = (pointer)&local_470.oneline_description.field_2;
  local_470.skip_type_check = false;
  local_470.oneline_description._M_string_length = 0;
  local_470.oneline_description.field_2._M_local_buf[0] = '\0';
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_470._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff4c0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff4e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff500;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff508;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_01._M_dataplus._M_p._1_1_ = in_stack_fffffffffffff539;
  description_01._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff538;
  description_01._M_dataplus._M_p._2_6_ = in_stack_fffffffffffff53a;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff540;
  description_01.field_2 = in_stack_fffffffffffff548;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff568._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff568._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff568._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff568[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff568[0x31];
  opts._66_6_ = in_stack_fffffffffffff568._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff558[0];
  opts._1_7_ = in_stack_fffffffffffff558._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558._8_8_;
  RPCArg::RPCArg(local_388,name,(Type)local_3a8,fallback,description_01,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"label",(allocator<char> *)&stack0xfffffffffffff53d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"current label if address exists, otherwise \"\"",
             (allocator<char> *)&stack0xfffffffffffff53c);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_4f0,&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            (local_530,"An optional label",(allocator<char> *)&stack0xfffffffffffff53b);
  local_578.oneline_description._M_dataplus._M_p = (pointer)&local_578.oneline_description.field_2;
  local_578.skip_type_check = false;
  local_578.oneline_description._M_string_length = 0;
  local_578.oneline_description.field_2._M_local_buf[0] = '\0';
  local_578.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_578.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_578.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_578._58_8_ = 0;
  name_00._M_string_length = in_stack_fffffffffffff4c0;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff4e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff500;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff508;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_02._M_dataplus._M_p._1_1_ = in_stack_fffffffffffff539;
  description_02._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff538;
  description_02._M_dataplus._M_p._2_6_ = in_stack_fffffffffffff53a;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff540;
  description_02.field_2 = in_stack_fffffffffffff548;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff568._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff568._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff568._24_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff568[0x30];
  opts_00.also_positional = (bool)in_stack_fffffffffffff568[0x31];
  opts_00._66_6_ = in_stack_fffffffffffff568._50_6_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff558[0];
  opts_00._1_7_ = in_stack_fffffffffffff558._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558._8_8_;
  RPCArg::RPCArg(local_388 + 1,name_00,(Type)local_490,fallback_00,description_02,opts_00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"rescan",(allocator<char> *)&stack0xfffffffffffff53a);
  bVar5 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_650,(bool *)&stack0xfffffffffffff539);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_5f8,&local_650);
  std::__cxx11::string::string<std::allocator<char>>
            (local_670,"Scan the chain and mempool for wallet transactions.",
             (allocator<char> *)&stack0xfffffffffffff538);
  local_6b8.oneline_description._M_dataplus._M_p = (pointer)&local_6b8.oneline_description.field_2;
  local_6b8.skip_type_check = false;
  local_6b8.oneline_description._M_string_length = 0;
  local_6b8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6b8._58_8_ = 0;
  name_01._M_string_length = in_stack_fffffffffffff4c0;
  name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name_01.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff4e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff500;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff508;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_03._M_dataplus._M_p._1_1_ = bVar5;
  description_03._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff538;
  description_03._M_dataplus._M_p._2_6_ = in_stack_fffffffffffff53a;
  description_03._M_string_length = (size_type)in_stack_fffffffffffff540;
  description_03.field_2 = in_stack_fffffffffffff548;
  opts_01.oneline_description._M_string_length = in_stack_fffffffffffff568._0_8_;
  opts_01.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff568._8_16_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff568._24_24_;
  opts_01.hidden = (bool)in_stack_fffffffffffff568[0x30];
  opts_01.also_positional = (bool)in_stack_fffffffffffff568[0x31];
  opts_01._66_6_ = in_stack_fffffffffffff568._50_6_;
  opts_01.skip_type_check = (bool)in_stack_fffffffffffff558[0];
  opts_01._1_7_ = in_stack_fffffffffffff558._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558._8_8_;
  RPCArg::RPCArg(local_388 + 2,name_01,(Type)local_598,fallback_01,description_03,opts_01);
  __l._M_len = 3;
  __l._M_array = local_388;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff540,__l,
             (allocator_type *)&stack0xfffffffffffff537);
  std::__cxx11::string::string<std::allocator<char>>
            (local_760,"",(allocator<char> *)&stack0xfffffffffffff517);
  std::__cxx11::string::string<std::allocator<char>>
            (local_780,"",(allocator<char> *)&stack0xfffffffffffff516);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description._M_string_length = in_stack_fffffffffffff4e0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description.field_2 = in_stack_fffffffffffff4e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_740,NONE,m_key_name,description,inner,SUB81(local_760,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4c0;
  result._0_8_ = in_stack_fffffffffffff4b8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff4c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff4e8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result._88_24_ = in_stack_fffffffffffff510;
  result.m_cond._8_16_ = in_stack_fffffffffffff528;
  result.m_cond.field_2._M_local_buf[8] = (char)in_stack_fffffffffffff538;
  result.m_cond.field_2._M_local_buf[9] = bVar5;
  result.m_cond.field_2._10_6_ = in_stack_fffffffffffff53a;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff518,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"dumpprivkey",(allocator<char> *)&stack0xfffffffffffff4f7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"\"myaddress\"",(allocator<char> *)&stack0xfffffffffffff4f6);
  HelpExampleCli(&local_8e0,&local_900,&local_920);
  std::operator+(&local_8c0,"\nDump a private key\n",&local_8e0);
  std::operator+(&local_8a0,&local_8c0,"\nImport the private key with rescan\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"importprivkey",(allocator<char> *)&stack0xfffffffffffff4f5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"\"mykey\"",(allocator<char> *)&stack0xfffffffffffff4f4);
  HelpExampleCli(&local_940,&local_960,&local_980);
  std::operator+(&local_880,&local_8a0,&local_940);
  std::operator+(&local_860,&local_880,"\nImport using a label and without rescan\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"importprivkey",(allocator<char> *)&stack0xfffffffffffff4f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"\"mykey\" \"testing\" false",
             (allocator<char> *)&stack0xfffffffffffff4f2);
  HelpExampleCli(&local_9a0,&local_9c0,&local_9e0);
  std::operator+(&local_840,&local_860,&local_9a0);
  std::operator+(&local_820,&local_840,"\nImport using default blank label and without rescan\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a20,"importprivkey",(allocator<char> *)&stack0xfffffffffffff4f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"\"mykey\" \"\" false",(allocator<char> *)&stack0xfffffffffffff4f0
            );
  HelpExampleCli(&local_a00,&local_a20,&local_a40);
  std::operator+(&local_800,&local_820,&local_a00);
  std::operator+(&local_7e0,&local_800,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff580,"importprivkey",
             (allocator<char> *)&stack0xfffffffffffff4ef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff560,"\"mykey\", \"testing\", false",
             (allocator<char> *)&stack0xfffffffffffff4ee);
  HelpExampleRpc(&local_a60,(string *)&stack0xfffffffffffff580,(string *)&stack0xfffffffffffff560);
  std::operator+(&local_7c0,&local_7e0,&local_a60);
  local_7a0 = local_790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p == &local_7c0.field_2) {
    uStack_788 = local_7c0.field_2._8_8_;
  }
  else {
    local_7a0 = local_7c0._M_dataplus._M_p;
  }
  local_798 = local_7c0._M_string_length;
  local_7c0._M_string_length = 0;
  local_7c0.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:145:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:145:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffff4e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  examples.m_examples.field_2._M_local_buf[0] = (char)in_stack_fffffffffffff538;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff528._8_8_;
  examples.m_examples.field_2._M_local_buf[1] = bVar5;
  examples.m_examples.field_2._M_allocated_capacity._2_6_ = in_stack_fffffffffffff53a;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff540;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff558._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff558._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff548._M_local_buf;
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff4c0,&stack0xfffffffffffff4c8)),
             description_00,args,(RPCResults)in_stack_fffffffffffff510,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff4c8);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff560);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff580);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_900);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  RPCResult::~RPCResult(&local_740);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
  std::__cxx11::string::~string(local_780);
  std::__cxx11::string::~string(local_760);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff540);
  lVar1 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_388[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_6b8);
  std::__cxx11::string::~string(local_670);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_5f8);
  UniValue::~UniValue(&local_650);
  std::__cxx11::string::~string(local_598);
  RPCArgOptions::~RPCArgOptions(&local_578);
  std::__cxx11::string::~string(local_530);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string(local_490);
  RPCArgOptions::~RPCArgOptions(&local_470);
  std::__cxx11::string::~string(local_428);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_408._M_first);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importprivkey()
{
    return RPCHelpMan{"importprivkey",
                "\nAdds a private key (as returned by dumpprivkey) to your wallet. Requires a new wallet backup.\n"
                "Hint: use importmulti to import more than one private key.\n"
            "\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\n"
            "may report that the imported key exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\n"
            "The rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\n"
            "but the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\n"
            "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
            "Note: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n",
                {
                    {"privkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The private key (see dumpprivkey)"},
                    {"label", RPCArg::Type::STR, RPCArg::DefaultHint{"current label if address exists, otherwise \"\""}, "An optional label"},
                    {"rescan", RPCArg::Type::BOOL, RPCArg::Default{true}, "Scan the chain and mempool for wallet transactions."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nDump a private key\n"
            + HelpExampleCli("dumpprivkey", "\"myaddress\"") +
            "\nImport the private key with rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\"") +
            "\nImport using a label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"testing\" false") +
            "\nImport using default blank label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"\" false") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("importprivkey", "\"mykey\", \"testing\", false")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Cannot import private keys to a wallet with private keys disabled");
    }

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    WalletRescanReserver reserver(*pwallet);
    bool fRescan = true;
    {
        LOCK(pwallet->cs_wallet);

        EnsureWalletIsUnlocked(*pwallet);

        std::string strSecret = request.params[0].get_str();
        const std::string strLabel{LabelFromValue(request.params[1])};

        // Whether to perform rescan after import
        if (!request.params[2].isNull())
            fRescan = request.params[2].get_bool();

        if (fRescan && pwallet->chain().havePruned()) {
            // Exit early and print an error.
            // If a block is pruned after this check, we will import the key(s),
            // but fail the rescan with a generic error.
            throw JSONRPCError(RPC_WALLET_ERROR, "Rescan is disabled when blocks are pruned");
        }

        if (fRescan && !reserver.reserve()) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
        }

        CKey key = DecodeSecret(strSecret);
        if (!key.IsValid()) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");

        CPubKey pubkey = key.GetPubKey();
        CHECK_NONFATAL(key.VerifyPubKey(pubkey));
        CKeyID vchAddress = pubkey.GetID();
        {
            pwallet->MarkDirty();

            // We don't know which corresponding address will be used;
            // label all new addresses, and label existing addresses if a
            // label was passed.
            for (const auto& dest : GetAllDestinationsForKey(pubkey)) {
                if (!request.params[1].isNull() || !pwallet->FindAddressBookEntry(dest)) {
                    pwallet->SetAddressBook(dest, strLabel, AddressPurpose::RECEIVE);
                }
            }

            // Use timestamp of 1 to scan the whole chain
            if (!pwallet->ImportPrivKeys({{vchAddress, key}}, 1)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Error adding key to wallet");
            }

            // Add the wpkh script for this key if possible
            if (pubkey.IsCompressed()) {
                pwallet->ImportScripts({GetScriptForDestination(WitnessV0KeyHash(vchAddress))}, /*timestamp=*/0);
            }
        }
    }
    if (fRescan) {
        RescanWallet(*pwallet, reserver);
    }

    return UniValue::VNULL;
},
    };
}